

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

TCGv_i32 gen_load_gpr(DisasContext_conflict8 *dc,int reg)

{
  TCGContext_conflict8 *tcg_ctx;
  TCGv_i64 ret;
  
  tcg_ctx = dc->uc->tcg_ctx;
  if (reg < 1) {
    ret = (TCGv_i64)get_temp_tl(dc);
    tcg_gen_movi_i64_sparc64(tcg_ctx,(TCGv_i32)ret,0);
  }
  else {
    if (0x1f < (uint)reg) {
      __assert_fail("reg < 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/sparc/translate.c"
                    ,0x12a,"TCGv_i64 gen_load_gpr(DisasContext *, int)");
    }
    ret = tcg_ctx->cpu_regs[(uint)reg];
  }
  return (TCGv_i32)ret;
}

Assistant:

static inline TCGv gen_load_gpr(DisasContext *dc, int reg)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    if (reg > 0) {
        assert(reg < 32);
        return tcg_ctx->cpu_regs[reg];
    } else {
        TCGv t = get_temp_tl(dc);
        tcg_gen_movi_tl(tcg_ctx, t, 0);
        return t;
    }
}